

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O2

CheckedError __thiscall
flatbuffers::EnumValBuilder::ValidateValue(EnumValBuilder *this,int64_t *ev,bool next)

{
  string *msg;
  int m;
  undefined7 in_register_00000011;
  allocator<char> local_39;
  string local_38 [32];
  
  m = (int)CONCAT71(in_register_00000011,next);
  switch(*(undefined4 *)(ev[1] + 0xd0)) {
  case 1:
    ValidateImpl<(flatbuffers::BaseType)1,unsigned_char>(this,ev,m);
    break;
  case 2:
    ValidateImpl<(flatbuffers::BaseType)2,unsigned_char>(this,ev,m);
    break;
  case 3:
    ValidateImpl<(flatbuffers::BaseType)3,signed_char>(this,ev,m);
    break;
  case 4:
    ValidateImpl<(flatbuffers::BaseType)4,unsigned_char>(this,ev,m);
    break;
  case 5:
    ValidateImpl<(flatbuffers::BaseType)5,short>(this,ev,m);
    break;
  case 6:
    ValidateImpl<(flatbuffers::BaseType)6,unsigned_short>(this,ev,m);
    break;
  case 7:
    ValidateImpl<(flatbuffers::BaseType)7,int>(this,ev,m);
    break;
  case 8:
    ValidateImpl<(flatbuffers::BaseType)8,unsigned_int>(this,ev,m);
    break;
  case 9:
    ValidateImpl<(flatbuffers::BaseType)9,long>(this,ev,m);
    break;
  case 10:
    ValidateImpl<(flatbuffers::BaseType)10,unsigned_long>(this,ev,m);
    break;
  default:
    msg = (string *)*ev;
    std::__cxx11::string::string<std::allocator<char>>
              (local_38,"fatal: invalid enum underlying type",&local_39);
    Parser::Error((Parser *)this,msg);
    std::__cxx11::string::~string(local_38);
  }
  return SUB82(this,0);
}

Assistant:

FLATBUFFERS_CHECKED_ERROR ValidateValue(int64_t *ev, bool next) {
    // clang-format off
    switch (enum_def.underlying_type.base_type) {
    #define FLATBUFFERS_TD(ENUM, IDLTYPE, CTYPE, ...)                   \
      case BASE_TYPE_##ENUM: {                                          \
        if (!IsInteger(BASE_TYPE_##ENUM)) break;                        \
        return ValidateImpl<BASE_TYPE_##ENUM, CTYPE>(ev, next ? 1 : 0); \
      }
      FLATBUFFERS_GEN_TYPES_SCALAR(FLATBUFFERS_TD)
    #undef FLATBUFFERS_TD
    default: break;
    }
    // clang-format on
    return parser.Error("fatal: invalid enum underlying type");
  }